

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

Component __thiscall
ftxui::Slider<long>(ftxui *this,ConstStringRef *label,long *value,long min,long max,long increment)

{
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar2;
  ConstStringRef local_48;
  long local_20;
  long *local_18;
  
  local_48.owned_.field_2._8_8_ = increment;
  local_48.address_ = (string *)max;
  local_20 = min;
  local_18 = value;
  std::make_shared<ftxui::SliderBase<long>,ftxui::ConstStringRef&,long*&,long&,long&,long&>
            (&local_48,(long **)label,(long *)&local_18,&local_20,(long *)&local_48.address_);
  sVar1 = local_48.owned_._M_string_length;
  local_48.owned_._M_string_length = 0;
  *(pointer *)this = local_48.owned_._M_dataplus._M_p;
  *(size_type *)(this + 8) = sVar1;
  local_48.owned_._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.owned_._M_string_length);
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}